

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O2

bool TCMalloc_SystemRelease(void *start,size_t length)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  size_t __len;
  void *__addr;
  bool bVar4;
  
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::
      FLAGS_malloc_disable_memory_release == '\0') {
    if (pagesize == 0) {
      iVar1 = getpagesize();
      pagesize = (size_t)iVar1;
    }
    __addr = (void *)((long)start + (pagesize - 1) & -pagesize);
    pvVar3 = (void *)(-pagesize & length + (long)start);
    __len = (long)pvVar3 - (long)__addr;
    if (__addr <= pvVar3 && __len != 0) {
      do {
        iVar1 = madvise(__addr,__len,4);
        piVar2 = __errno_location();
        bVar4 = iVar1 != -1;
        if (bVar4) {
          return bVar4;
        }
      } while (*piVar2 == 0xb);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool TCMalloc_SystemRelease(void* start, size_t length) {
#if defined(FREE_MMAP_PROT_NONE) && defined(HAVE_MMAP) || defined(MADV_FREE)
  if (FLAGS_malloc_disable_memory_release) return false;
  if (pagesize == 0) pagesize = getpagesize();
  const size_t pagemask = pagesize - 1;

  size_t new_start = reinterpret_cast<size_t>(start);
  size_t end = new_start + length;
  size_t new_end = end;

  // Round up the starting address and round down the ending address
  // to be page aligned:
  new_start = (new_start + pagesize - 1) & ~pagemask;
  new_end = new_end & ~pagemask;

  ASSERT((new_start & pagemask) == 0);
  ASSERT((new_end & pagemask) == 0);
  ASSERT(new_start >= reinterpret_cast<size_t>(start));
  ASSERT(new_end <= end);

  if (new_end > new_start) {
    bool result, retry;
    do {
#if defined(FREE_MMAP_PROT_NONE) && defined(HAVE_MMAP)
      // mmap PROT_NONE is similar to munmap by freeing backing pages by
      // physical memory except using MAP_FIXED keeps virtual memory range
      // reserved to be remapped back later
      void* ret = mmap(reinterpret_cast<char*>(new_start), new_end - new_start,
          PROT_NONE, MAP_PRIVATE|MAP_ANONYMOUS|MAP_FIXED, -1, 0);

      result = ret != MAP_FAILED;
#else
      int ret = madvise(reinterpret_cast<char*>(new_start),
          new_end - new_start, MADV_FREE);

      result = ret != -1;
#endif
      retry = errno == EAGAIN;
    } while (!result && retry);

    return result;
  }
#endif 
  return false;
}